

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileline.c
# Opt level: O0

int fileline_initialize(backtrace_state *state,backtrace_error_callback error_callback,void *data)

{
  bool bVar1;
  __pid_t _Var2;
  int iVar3;
  int local_9c;
  char local_98 [4];
  int does_not_exist;
  char buf [64];
  char *local_50;
  char *filename;
  int descriptor;
  int called_error_callback;
  int pass;
  fileline fileline_fn;
  void *pvStack_28;
  int failed;
  void *data_local;
  backtrace_error_callback error_callback_local;
  backtrace_state *state_local;
  
  pvStack_28 = data;
  data_local = error_callback;
  error_callback_local = (backtrace_error_callback)state;
  if (state->threaded != 0) {
    abort();
  }
  fileline_fn._4_4_ = state->fileline_initialization_failed;
  if (fileline_fn._4_4_ == 0) {
    if (state->threaded != 0) {
      abort();
    }
    if (state->fileline_fn == (fileline)0x0) {
      filename._4_4_ = -1;
      bVar1 = false;
      fileline_fn._4_4_ = 0;
      _called_error_callback = (fileline)0x0;
      for (descriptor = 0; descriptor < 10; descriptor = descriptor + 1) {
        switch(descriptor) {
        case 0:
          local_50 = *(char **)error_callback_local;
          break;
        case 1:
          local_50 = (char *)0x0;
          break;
        case 2:
          local_50 = (char *)0x0;
          break;
        case 3:
          local_50 = "/proc/self/exe";
          break;
        case 4:
          local_50 = "/proc/curproc/file";
          break;
        case 5:
          _Var2 = getpid();
          snprintf(local_98,0x40,"/proc/%ld/object/a.out",(long)_Var2);
          local_50 = local_98;
          break;
        case 6:
          local_50 = (char *)0x0;
          break;
        case 7:
          local_50 = (char *)0x0;
          break;
        case 8:
          local_50 = (char *)0x0;
          break;
        case 9:
          local_50 = (char *)0x0;
          break;
        default:
          abort();
        }
        if (local_50 != (char *)0x0) {
          filename._4_4_ =
               tcmalloc_backtrace_open
                         (local_50,(backtrace_error_callback)data_local,pvStack_28,&local_9c);
          if ((filename._4_4_ < 0) && (local_9c == 0)) {
            bVar1 = true;
            break;
          }
          if (-1 < filename._4_4_) break;
        }
      }
      if (filename._4_4_ < 0) {
        if (!bVar1) {
          if (*(long *)error_callback_local == 0) {
            (*(code *)data_local)(pvStack_28,"libbacktrace could not find executable to open",0);
          }
          else {
            (*(code *)data_local)(pvStack_28,*(undefined8 *)error_callback_local,2);
          }
        }
        fileline_fn._4_4_ = 1;
      }
      if ((fileline_fn._4_4_ == 0) &&
         (iVar3 = tcmalloc_backtrace_initialize
                            ((backtrace_state *)error_callback_local,local_50,filename._4_4_,
                             (backtrace_error_callback)data_local,pvStack_28,
                             (fileline *)&called_error_callback), iVar3 == 0)) {
        fileline_fn._4_4_ = 1;
      }
      if (fileline_fn._4_4_ == 0) {
        if (*(int *)(error_callback_local + 8) != 0) {
          abort();
        }
        *(fileline *)(error_callback_local + 0x18) = _called_error_callback;
        state_local._4_4_ = 1;
      }
      else {
        if (*(int *)(error_callback_local + 8) != 0) {
          abort();
        }
        *(undefined4 *)(error_callback_local + 0x38) = 1;
        state_local._4_4_ = 0;
      }
    }
    else {
      state_local._4_4_ = 1;
    }
  }
  else {
    (*error_callback)(data,"failed to read executable information",-1);
    state_local._4_4_ = 0;
  }
  return state_local._4_4_;
}

Assistant:

static int
fileline_initialize (struct backtrace_state *state,
		     backtrace_error_callback error_callback, void *data)
{
  int failed;
  fileline fileline_fn;
  int pass;
  int called_error_callback;
  int descriptor;
  const char *filename;
  char buf[FILENAME_BUF_SIZE];

  if (!state->threaded)
    failed = state->fileline_initialization_failed;
  else
    failed = backtrace_atomic_load_int (&state->fileline_initialization_failed);

  if (failed)
    {
      error_callback (data, "failed to read executable information", -1);
      return 0;
    }

  if (!state->threaded)
    fileline_fn = state->fileline_fn;
  else
    fileline_fn = backtrace_atomic_load_pointer (&state->fileline_fn);
  if (fileline_fn != NULL)
    return 1;

  /* We have not initialized the information.  Do it now.  */

  descriptor = -1;
  called_error_callback = 0;
  for (pass = 0; pass < 10; ++pass)
    {
      int does_not_exist;

      switch (pass)
	{
	case 0:
	  filename = state->filename;
	  break;
	case 1:
	  filename = getexecname ();
	  break;
	case 2:
	  /* Test this before /proc/self/exe, as the latter exists but points
	     to the wine binary (and thus doesn't work).  */
	  filename = windows_executable_filename ();
	  break;
	case 3:
	  filename = "/proc/self/exe";
	  break;
	case 4:
	  filename = "/proc/curproc/file";
	  break;
	case 5:
	  snprintf (buf, sizeof (buf), "/proc/%ld/object/a.out",
		    (long) getpid ());
	  filename = buf;
	  break;
	case 6:
	  filename = sysctl_exec_name1 (state, error_callback, data);
	  break;
	case 7:
	  filename = sysctl_exec_name2 (state, error_callback, data);
	  break;
	case 8:
	  filename = macho_get_executable_path (state, error_callback, data);
	  break;
	case 9:
	  filename = windows_get_executable_path (buf, error_callback, data);
	  break;
	default:
	  abort ();
	}

      if (filename == NULL)
	continue;

      descriptor = backtrace_open (filename, error_callback, data,
				   &does_not_exist);
      if (descriptor < 0 && !does_not_exist)
	{
	  called_error_callback = 1;
	  break;
	}
      if (descriptor >= 0)
	break;
    }

  if (descriptor < 0)
    {
      if (!called_error_callback)
	{
	  if (state->filename != NULL)
	    error_callback (data, state->filename, ENOENT);
	  else
	    error_callback (data,
			    "libbacktrace could not find executable to open",
			    0);
	}
      failed = 1;
    }

  if (!failed)
    {
      if (!backtrace_initialize (state, filename, descriptor, error_callback,
				 data, &fileline_fn))
	failed = 1;
    }

  if (failed)
    {
      if (!state->threaded)
	state->fileline_initialization_failed = 1;
      else
	backtrace_atomic_store_int (&state->fileline_initialization_failed, 1);
      return 0;
    }

  if (!state->threaded)
    state->fileline_fn = fileline_fn;
  else
    {
      backtrace_atomic_store_pointer (&state->fileline_fn, fileline_fn);

      /* Note that if two threads initialize at once, one of the data
	 sets may be leaked.  */
    }

  return 1;
}